

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O2

void render_task(parallel_task_2d *task,size_t thread_id)

{
  int iVar1;
  double *pdVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  int i;
  int iVar8;
  uint uVar9;
  int n;
  int j;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  double dVar15;
  double dVar16;
  
  sVar3 = task->range[0].begin;
  sVar4 = task->range[0].end;
  sVar5 = task->range[1].end;
  pdVar2 = (double *)task[1].work_item.work_fn;
  for (iVar8 = (int)task->range[1].begin; iVar8 < (int)sVar5; iVar8 = iVar8 + 1) {
    for (iVar10 = (int)sVar3; iVar10 < (int)sVar4; iVar10 = iVar10 + 1) {
      iVar14 = (int)*(undefined8 *)((long)pdVar2 + 0x24);
      iVar1 = (int)((ulong)*(undefined8 *)((long)pdVar2 + 0x24) >> 0x20);
      auVar12._0_8_ = pdVar2[1] * (double)(iVar10 + -1) + *pdVar2 * (double)(iVar14 - iVar10);
      auVar12._8_8_ = pdVar2[3] * (double)(iVar8 + -1) + pdVar2[2] * (double)(iVar1 - iVar8);
      auVar13._0_8_ = (double)(iVar14 + -1);
      auVar13._8_8_ = (double)(iVar1 + -1);
      auVar12 = divpd(auVar12,auVar13);
      iVar1 = *(int *)(pdVar2 + 4);
      iVar7 = 0;
      if (0 < iVar1) {
        iVar7 = iVar1;
      }
      uVar9 = 1;
      dVar11 = auVar12._0_8_;
      dVar15 = auVar12._8_8_;
      while (((uVar6 = iVar7 + 1, uVar9 - iVar7 != 1 &&
              (dVar16 = (dVar11 * dVar11 - dVar15 * dVar15) + auVar12._0_8_, uVar6 = uVar9,
              ABS(dVar16) <= 2.0)) &&
             (dVar15 = (dVar11 + dVar11) * dVar15 + auVar12._8_8_, ABS(dVar15) <= 2.0))) {
        uVar9 = uVar9 + 1;
        dVar11 = dVar16;
      }
      if ((uVar6 & 1) == 0) {
        dVar11 = pow((double)(int)uVar6 / (double)iVar1,0.125);
        uVar6 = (int)(dVar11 * 255.0) & 0xff;
        uVar9 = (uVar6 * 3) / 5;
        uVar6 = uVar6 << 0x10;
        iVar14 = *(int *)((long)pdVar2 + 0x24);
      }
      else {
        uVar6 = 0xff0000;
        uVar9 = 0xff;
      }
      *(uint *)((long)pdVar2[6] + (long)(iVar14 * iVar8 + iVar10) * 4) = uVar9 << 8 | uVar6 | uVar9;
    }
  }
  return;
}

Assistant:

static void render_task(struct parallel_task_2d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct render_task* render_task = (void*)task;
    struct tile tile = {
        .i = render_task->task.range[1].begin,
        .j = render_task->task.range[0].begin,
        .m = render_task->task.range[1].end,
        .n = render_task->task.range[0].end
    };
    render_tile(&tile, render_task->global_data);
}